

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O1

int __thiscall TinyProcessLib::Process::get_exit_status(Process *this)

{
  __pid_t _Var1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  undefined8 uVar5;
  int *__stat_loc;
  int exit_status;
  uint local_1c;
  
  if ((this->data).id < 1) {
    uVar3 = 0xffffffff;
  }
  else {
    __stat_loc = (int *)&local_1c;
    do {
      _Var1 = waitpid((this->data).id,__stat_loc,0);
      if (-1 < _Var1) goto LAB_001674b1;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if (*piVar4 == 10) {
      __stat_loc = &(this->data).exit_status;
    }
    else {
LAB_001674b1:
      if (0xff < (int)local_1c) {
        local_1c = local_1c >> 8;
      }
      (this->data).exit_status = local_1c;
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->close_mutex);
      if (iVar2 != 0) {
        uVar5 = std::__throw_system_error(iVar2);
        __clang_call_terminate(uVar5);
      }
      this->closed = true;
      pthread_mutex_unlock((pthread_mutex_t *)&this->close_mutex);
      close_fds(this);
    }
    uVar3 = *__stat_loc;
  }
  return uVar3;
}

Assistant:

int Process::get_exit_status() noexcept {
  if(data.id <= 0)
    return -1;

  int exit_status;
  id_type p;
  do
  {
    p = waitpid(data.id, &exit_status, 0);
  }
  while(p < 0 && errno == EINTR);

  if(p < 0 && errno == ECHILD) {
    // PID doesn't exist anymore, return previously sampled exit status (or -1)
    return data.exit_status;
  }
  else {
    // store exit status for future calls
    if(exit_status >= 256)
      exit_status = exit_status >> 8;
    data.exit_status = exit_status;
  }

  {
    std::lock_guard<std::mutex> lock(close_mutex);
    closed = true;
  }
  close_fds();

  return exit_status;
}